

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void seq_print(uint32_t *script,uint32_t len,rnndeccontext *ctx,rnndomain *mmiodom)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  rnndecaddrinfo *prVar4;
  char *pcVar5;
  rnndecaddrinfo *ai;
  char *wait_op;
  uint i;
  uint reg1;
  char *reg0;
  uint size;
  uint op;
  uint pc;
  rnndomain *mmiodom_local;
  rnndeccontext *ctx_local;
  uint32_t len_local;
  uint32_t *script_local;
  
  size = 0;
  while( true ) {
    if (len <= size) {
      printf("SEQ script, size: %uB\n",(ulong)(len << 2));
      size = 0;
      while( true ) {
        if (len <= size) {
          return;
        }
        uVar2 = script[size] & 0xffff;
        uVar3 = script[size] >> 0x10;
        if (0x3c < uVar2) break;
        if (uVar3 < seq_ops[uVar2].min_size) {
          printf("%06x: Opcode size too small\n",(ulong)(size << 2));
          return;
        }
        switch(uVar2) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
        case 9:
          pcVar5 = "val_last";
          if ((script[size] & 1) != 0) {
            pcVar5 = "reg_last";
          }
          printf("%06x: %-14s%s      %s 0x%08x\n",(ulong)(size << 2),seq_ops[uVar2].txt,pcVar5,
                 seq_ops[uVar2 >> 1].binop,(ulong)script[size + 1]);
          break;
        case 10:
        case 0xb:
        case 0xc:
          _i = "";
          wait_op._4_4_ = 0;
          if ((uVar2 == 10) || (uVar2 == 0xc)) {
            _i = "reg_last+";
          }
          if ((uVar2 == 0xb) || (uVar2 == 0xc)) {
            wait_op._4_4_ = script[size + 1];
          }
          printf("%06x: %-14sval_last   :=  R[%s0x%06x]\n",(ulong)(size << 2),seq_ops[uVar2].txt,_i,
                 (ulong)wait_op._4_4_);
          break;
        case 0xd:
        case 0xe:
        case 0xf:
          _i = "";
          wait_op._4_4_ = 0;
          if ((uVar2 == 0xd) || (uVar2 == 0xf)) {
            _i = "reg_last+";
          }
          if ((uVar2 == 0xe) || (uVar2 == 0xf)) {
            wait_op._4_4_ = script[size + 1];
          }
          printf("%06x: %-14sR[%s0x%06x]   :=  val_last\n",(ulong)(size << 2),seq_ops[uVar2].txt,_i,
                 (ulong)wait_op._4_4_);
          break;
        default:
          printf("%06x: %-14s\n",(ulong)(size << 2),seq_ops[uVar2].txt);
          break;
        case 0x13:
        case 0x2e:
          printf("%06x: %-14s%u ns\n",(ulong)(size << 2),seq_ops[uVar2].txt,(ulong)script[size + 1])
          ;
          break;
        case 0x14:
          sVar1 = (short)script[size + 1];
          if (sVar1 == 0) {
            ai = (rnndecaddrinfo *)0x25e787;
          }
          else if (sVar1 == 1) {
            ai = (rnndecaddrinfo *)0x25e795;
          }
          else if (sVar1 == 0x100) {
            ai = (rnndecaddrinfo *)0x25e7a3;
          }
          else if (sVar1 == 0x101) {
            ai = (rnndecaddrinfo *)0x25e7b1;
          }
          else if (sVar1 == 0x300) {
            ai = (rnndecaddrinfo *)anon_var_dwarf_1b31c;
          }
          else if (sVar1 == 0x400) {
            ai = (rnndecaddrinfo *)anon_var_dwarf_1b326;
          }
          else {
            ai = (rnndecaddrinfo *)anon_var_dwarf_1b331;
            printf("%06x: Invalid param %08x for op 0x14\n",(ulong)(size << 2),
                   (ulong)script[size + 1]);
          }
          if ((script[size + 1] & 0x10000) == 0) {
            printf("%06x: %-14s%s  , %u ns\n",(ulong)(size << 2),seq_ops[uVar2].txt,ai,
                   (ulong)script[size + 2]);
          }
          else {
            printf("%06x: %-14s!%s , %u ns\n",(ulong)(size << 2),seq_ops[uVar2].txt,ai,
                   (ulong)script[size + 2]);
          }
          break;
        case 0x15:
          printf("%06x: %-14sR[last_reg] & 0x%08x == val_last, %u ns\n",(ulong)(size << 2),
                 seq_ops[uVar2].txt,(ulong)script[size + 1],(ulong)script[size + 2]);
          break;
        case 0x16:
          printf("%06x: %-14s\n",(ulong)(size << 2),seq_ops[uVar2].txt);
          break;
        case 0x17:
          printf("%06x: %-14sval_last, %08x\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1]);
          break;
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
          printf("%06x: %-14s0x%06x\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)(script[size + 1] << 2));
          break;
        case 0x1d:
        case 0x1e:
          printf("%06x: %-14s\n",(ulong)(size << 2),seq_ops[uVar2].txt);
          break;
        case 0x1f:
        case 0x2c:
          printf("%06x: %-14sval_last      %s R[0x%06x]\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 seq_ops[uVar2].binop,(ulong)script[size + 1]);
          break;
        case 0x20:
          if (script[size + 1] == 1) {
            printf("%06x: FB PAUSE\n",(ulong)(size << 2));
          }
          else {
            printf("%06x: FB RESUME\n",(ulong)(size << 2));
          }
          break;
        case 0x21:
          printf("%06x: SET REGISTERS:\n",(ulong)(size << 2));
          for (wait_op._0_4_ = 1; (uint)wait_op < uVar3; wait_op._0_4_ = (uint)wait_op + 2) {
            prVar4 = rnndec_decodeaddr(ctx,mmiodom,(ulong)script[size + (uint)wait_op],1);
            printf("%06x:               R[0x%06x]   :=  0x%08x     # %s\n",
                   (ulong)((size + (uint)wait_op) * 4),(ulong)script[size + (uint)wait_op],
                   (ulong)script[size + (uint)wait_op + 1],prVar4->name);
          }
          printf("%06x:               reg_last      :=  0x%08x\n",
                 (ulong)((size + (uint)wait_op + -2) * 4),(ulong)script[(size + (uint)wait_op) - 2])
          ;
          printf("%06x:               val_last      :=  0x%08x\n",
                 (ulong)((size + (uint)wait_op + -2) * 4),(ulong)script[(size + (uint)wait_op) - 1])
          ;
          break;
        case 0x22:
        case 0x30:
        case 0x32:
          printf("%06x: %-14sOUT[0x%x]      %s val_last\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],seq_ops[uVar2].binop);
          break;
        case 0x23:
        case 0x31:
        case 0x33:
          printf("%06x: %-14sOUT[OUT[0x%x]] %s val_last\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],seq_ops[uVar2].binop);
          break;
        case 0x24:
          printf("%06x: %-14sOUT[0x%x]      :=  %08x\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],(ulong)script[size + 2]);
          break;
        case 0x25:
          printf("%06x: %-14sOUT[OUT[0x%x]] :=  %08x\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],(ulong)script[size + 2]);
          break;
        case 0x26:
        case 0x3b:
          printf("%06x: %-14sval_last      %s OUT[0x%x]\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 seq_ops[uVar2].binop,(ulong)script[size + 1]);
          break;
        case 0x27:
        case 0x3c:
          printf("%06x: %-14sval_last      %s OUT[OUT[0x%x]]\n",(ulong)(size << 2),
                 seq_ops[uVar2].txt,seq_ops[uVar2].binop,(ulong)script[size + 1]);
          break;
        case 0x28:
          printf("%06x: %-14sreg_last      :=  OUT[0x%x]\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1]);
          break;
        case 0x29:
          printf("%06x: %-14sreg_last      :=  OUT[OUT[0x%x]]\n",(ulong)(size << 2),
                 seq_ops[uVar2].txt,(ulong)script[size + 1]);
          break;
        case 0x2a:
          printf("%06x: %-14sOUT[0x%x]      +=  0x%08x (%d)\n",(ulong)(size << 2),seq_ops[uVar2].txt
                 ,(ulong)script[size + 1],(ulong)script[size + 2],(ulong)script[size + 2]);
          break;
        case 0x2b:
          printf("%06x: %-14sOUT[0x%x], 0x%08x\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],(ulong)script[size + 2]);
          break;
        case 0x2d:
          printf("%06x: %-14sHEAD%d HEAD%d\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1],(ulong)script[size + 2]);
          break;
        case 0x34:
          printf("%06x: %-14sOUT[0x%x]\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1]);
          break;
        case 0x35:
          printf("%06x: %-14sOUT[OUT[0x%x]]\n",(ulong)(size << 2),seq_ops[uVar2].txt,
                 (ulong)script[size + 1]);
        }
        size = uVar3 + size;
      }
      printf("%06x: Invalid op\n",(ulong)(size << 2));
      return;
    }
    uVar2 = script[size] >> 0x10;
    if (0x3c < (script[size] & 0xffff)) {
      return;
    }
    if (0x3ff < uVar2) break;
    if (uVar2 == 0) {
      return;
    }
    if (len < size + uVar2) {
      return;
    }
    size = uVar2 + size;
  }
  return;
}

Assistant:

void
seq_print(uint32_t *script, uint32_t len, struct rnndeccontext *ctx, struct rnndomain *mmiodom)
{
	unsigned int pc, op, size;
	char *reg0;
	unsigned int reg1, i;
	const char *wait_op;

	/* Validate script, bail if invalid */
	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c || size > 0x3ff || size == 0)
			return;

		if(pc + size > len)
			return;
	}

	printf("SEQ script, size: %uB\n", len << 2);

	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c) {
			seq_out(pc,"Invalid op\n");
			return;
		}

		if(seq_ops[op].min_size > size){
			seq_out(pc,"Opcode size too small\n");
			return;
		}

		switch(op) {
		case 0x0:
		case 0x1:
		case 0x2:
		case 0x3:
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0x8:
		case 0x9:
			seq_outlast(pc,op,script[pc+1]);
			break;
		case 0xa:
		case 0xb:
		case 0xc:
			reg0 = "";
			reg1 = 0;

			if(op == 0xa || op == 0x0c) {
			        reg0 = "reg_last+";
			}

			if (op == 0xb || op == 0xc) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"val_last   :=  R[%s0x%06x]\n",reg0,reg1);
			break;
		case 0xd:
		case 0xe:
		case 0xf:
			reg0 = "";
			reg1 = 0;

			if(op == 0xd || op == 0xf) {
			        reg0 = "reg_last+";
			}

			if (op == 0xe || op == 0xf) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"R[%s0x%06x]   :=  val_last\n",reg0,reg1);
			break;
		case 0x13:
		case 0x2e:
			seq_out_op(pc,op,"%u ns\n",script[pc+1]);
			break;
		case 0x14:
			//seq_out_op(pc,op,"%s, %u ns\n",seq_wait_status[script[pc+1] & 0xff],script[pc+2]);
			switch(script[pc+1] & 0xffff) {
			case 0x0:
				wait_op = "HEAD0_VBLANK";
				break;
			case 0x1:
				wait_op = "HEAD1_VBLANK";
				break;
			case 0x100:
				wait_op = "HEAD0_HBLANK";
				break;
			case 0x101:
				wait_op = "HEAD1_HBLANK";
				break;
			case 0x300:
				wait_op = "FB_PAUSED   ";
				break;
			case 0x400:
				wait_op = "PGRAPH_IDLE ";
				break;
			default:
				wait_op = "(unknown)   ";
				seq_out(pc,"Invalid param %08x for op 0x14\n", script[pc+1]);
			}

			if(script[pc+1] & 0x10000) {
				seq_out_op(pc,op,"!%s , %u ns\n",wait_op,script[pc+2]);
			} else {
				seq_out_op(pc,op,"%s  , %u ns\n",wait_op,script[pc+2]);
			}
			break;
		case 0x15:
			seq_out_op(pc,op,"R[last_reg] & 0x%08x == val_last, %u ns\n",script[pc+1],script[pc+2]);
			break;
		case 0x16:
			seq_out_op(pc,op,"\n");
			break;
		case 0x17:
			seq_out_op(pc,op,"val_last, %08x\n", script[pc+1]);
			break;
		case 0x18:
		case 0x19:
		case 0x1a:
		case 0x1b:
		case 0x1c:
			seq_out_op(pc,op,"0x%06x\n", script[pc+1] << 2);
			break;
		case 0x1d:
		case 0x1e:
			seq_out_op(pc,op,"\n");
			break;
		case 0x1f:
		case 0x2c:
			seq_out_op(pc,op,"val_last      %s R[0x%06x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x20:
			if(script[pc+1] == 1)
				seq_out(pc,"FB PAUSE\n");
			else
				seq_out(pc,"FB RESUME\n");
			break;
		case 0x21:
			seq_out(pc,"SET REGISTERS:\n");
			for (i = 1; i < size; i += 2) {
				struct rnndecaddrinfo *ai = rnndec_decodeaddr(ctx, mmiodom, script[pc+i], 1);
				seq_out(pc+i,"              R[0x%06x]   :=  0x%08x     # %s\n", script[pc+i], script[pc+i+1], ai->name);
			}
			seq_out(pc+i-2,"              reg_last      :=  0x%08x\n", script[pc+i-2]);
			seq_out(pc+i-2,"              val_last      :=  0x%08x\n", script[pc+i-1]);
			break;
		case 0x22:
		case 0x30:
		case 0x32:
			seq_out_op(pc,op,"OUT[0x%x]      %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x23:
		case 0x31:
		case 0x33:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x24:
			seq_out_op(pc,op,"OUT[0x%x]      :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x25:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x26:
		case 0x3b:
			seq_out_op(pc,op,"val_last      %s OUT[0x%x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x27:
		case 0x3c:
			seq_out_op(pc,op,"val_last      %s OUT[OUT[0x%x]]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x28:
			seq_out_op(pc,op,"reg_last      :=  OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x29:
			seq_out_op(pc,op,"reg_last      :=  OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		case 0x2a:
			seq_out_op(pc,op,"OUT[0x%x]      +=  0x%08x (%d)\n", script[pc+1], script[pc+2], script[pc+2]);
			break;
		case 0x2b:
			seq_out_op(pc,op,"OUT[0x%x], 0x%08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x2d:
			seq_out_op(pc,op,"HEAD%d HEAD%d\n", script[pc+1], script[pc+2]);
			break;
		case 0x34:
			seq_out_op(pc,op,"OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x35:
			seq_out_op(pc,op,"OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		default:
			seq_out_op(pc,op,"\n");
			break;
		}
	}
}